

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O1

void Js::CacheOperators::CachePropertyWrite
               (RecyclableObject *object,bool isRoot,Type *typeWithoutProperty,PropertyId propertyId
               ,PropertyValueInfo *info,ScriptContext *requestContext)

{
  InlineCacheFlags IVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  RecyclableObject *obj;
  long lVar6;
  DynamicTypeHandler *oldTypeHandler;
  DynamicTypeHandler *newTypeHandler;
  code *pcVar7;
  bool bVar8;
  PropertyIndex PVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  undefined4 *puVar15;
  RootObjectBase *this;
  DynamicObject *pDVar16;
  ushort uVar17;
  Type *pTVar18;
  Type *local_50;
  
  if (typeWithoutProperty == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xa5,"(typeWithoutProperty != nullptr)",
                                "typeWithoutProperty != nullptr");
    if (!bVar8) goto LAB_0096c5a6;
    *puVar15 = 0;
  }
  bVar8 = CanCachePropertyWrite(info,object,requestContext);
  if (!bVar8) {
    return;
  }
  IVar1 = info->flags;
  if (info->m_instance != object && IVar1 != InlineCacheSetterFlag) {
    if ((info->m_instance != (RecyclableObject *)0x0) && (info->m_propertyIndex == 0xffff)) {
      return;
    }
    iVar10 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[9])(object,(ulong)(uint)propertyId);
    if ((short)iVar10 == -1) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xb2,
                                "(info->IsNoCache() || object->GetPropertyIndex(propertyId) == Constants::NoSlot)"
                                ,"Missed updating PropertyValueInfo?");
    if (bVar8) {
      *puVar15 = 0;
      return;
    }
    goto LAB_0096c5a6;
  }
  uVar2 = info->m_propertyIndex;
  if (IVar1 == InlineCacheSetterFlag) {
    if (0xfff < uVar2) {
      return;
    }
  }
  else if (uVar2 == 0xffff) {
    return;
  }
  if (isRoot) {
    if (IVar1 != InlineCacheSetterFlag) {
LAB_0096bdd9:
      if (isRoot) {
        this = VarTo<Js::RootObjectBase,Js::RecyclableObject>(object);
        PVar9 = RootObjectBase::GetRootPropertyIndex(this,propertyId);
        if (uVar2 == PVar9) goto LAB_0096be4b;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,200,
                                  "((!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter || (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId)))"
                                  ,
                                  "(!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter || (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId))"
                                 );
      if (!bVar8) goto LAB_0096c5a6;
      *puVar15 = 0;
    }
  }
  else {
    iVar10 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[9])(object,(ulong)(uint)propertyId);
    if ((IVar1 != InlineCacheSetterFlag) && (uVar2 != (ushort)iVar10)) goto LAB_0096bdd9;
  }
LAB_0096be4b:
  bVar8 = DynamicType::Is(((object->type).ptr)->typeId);
  if (!bVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xc9,"(DynamicType::Is(object->GetTypeId()))",
                                "DynamicType::Is(object->GetTypeId())");
    if (!bVar8) goto LAB_0096c5a6;
    *puVar15 = 0;
  }
  if ((info->flags & InlineCacheGetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0xca,"((info->GetFlags() & InlineCacheGetterFlag) == 0)",
                                "invalid getter for CachePropertyWrite");
    if (!bVar8) goto LAB_0096c5a6;
    *puVar15 = 0;
  }
  obj = info->m_instance;
  pDVar16 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
  lVar6 = *(long *)((pDVar16->super_RecyclableObject).type.ptr + 1);
  uVar3 = *(ushort *)(lVar6 + 0x12);
  uVar17 = -uVar3;
  if (uVar2 < uVar3) {
    uVar17 = *(ushort *)(lVar6 + 10) >> 3;
  }
  uVar17 = uVar17 + uVar2;
  if (IVar1 == InlineCacheSetterFlag) {
    if ((obj == object) ||
       ((((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
        ptr == requestContext)) {
      Cache<true,false,false>
                (obj != object,pDVar16,false,(object->type).ptr,(Type *)0x0,propertyId,uVar17,
                 uVar2 < uVar3,false,0,info,requestContext);
    }
  }
  else {
    if (obj != object) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd4,"(instance == object)","invalid instance for non setter");
      if (!bVar8) goto LAB_0096c5a6;
      *puVar15 = 0;
    }
    bVar8 = DynamicType::Is(typeWithoutProperty->typeId);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd5,"(DynamicType::Is(typeWithoutProperty))",
                                  "DynamicType::Is(typeWithoutProperty)");
      if (!bVar8) goto LAB_0096c5a6;
      *puVar15 = 0;
    }
    if ((((info->m_instance == (RecyclableObject *)0x0) || (info->m_propertyIndex != 0xffff)) &&
        ((info->cacheInfoFlag & enableStoreFieldCacheFlag) != 0)) &&
       (iVar10 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x48])(object,(ulong)(uint)propertyId,isRoot),
       (char)iVar10 == '\0')) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd7,
                                  "(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot))"
                                  ,
                                  "info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot)"
                                 );
      if (!bVar8) goto LAB_0096c5a6;
      *puVar15 = 0;
    }
    if ((info->m_attributes & 4) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xd9,"(info->IsWritable())","info->IsWritable()");
      if (!bVar8) goto LAB_0096c5a6;
      *puVar15 = 0;
    }
    pTVar18 = (object->type).ptr;
    if (pTVar18 == (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0xde,"(newType)","newType");
      if (!bVar8) goto LAB_0096c5a6;
      *puVar15 = 0;
    }
    if ((pTVar18 == typeWithoutProperty) ||
       (*(char *)((long)&pTVar18[1].javascriptLibrary.ptr + 1) != '\x01')) {
      iVar10 = 0;
      local_50 = (Type *)0x0;
    }
    else {
      iVar10 = (**(code **)(**(long **)(pTVar18 + 1) + 0x270))();
      if ((iVar10 == 0) ||
         (oldTypeHandler = *(DynamicTypeHandler **)(typeWithoutProperty + 1),
         (oldTypeHandler->flags & 0x20) != 0)) {
        iVar10 = 0;
        local_50 = (Type *)0x0;
      }
      else {
        newTypeHandler = *(DynamicTypeHandler **)(pTVar18 + 1);
        iVar11 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x4e])(oldTypeHandler);
        if (iVar11 != 0) {
          iVar10 = oldTypeHandler->slotCapacity;
          iVar5 = newTypeHandler->slotCapacity;
          uVar12 = (uint)newTypeHandler->inlineSlotCapacity;
          iVar13 = (*oldTypeHandler->_vptr_DynamicTypeHandler[6])(oldTypeHandler);
          iVar14 = (*newTypeHandler->_vptr_DynamicTypeHandler[6])(newTypeHandler);
          if (iVar13 + 1 != iVar14) {
            iVar13 = (*oldTypeHandler->_vptr_DynamicTypeHandler[6])(oldTypeHandler);
            iVar14 = (*newTypeHandler->_vptr_DynamicTypeHandler[6])(newTypeHandler);
            if (iVar13 != iVar14) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar15 = 1;
              bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                          ,0xf7,
                                          "(((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() + 1 == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount() || ((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount())"
                                          ,
                                          "Don\'t cache type transitions that add multiple properties."
                                         );
              if (!bVar8) goto LAB_0096c5a6;
              *puVar15 = 0;
            }
          }
          bVar8 = DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining
                            (oldTypeHandler,newTypeHandler);
          if (!bVar8) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                        ,0xfb,
                                        "(DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(oldTypeHandler, newTypeHandler))"
                                        ,"TypeHandler should be compatible for transition.");
            if (!bVar8) goto LAB_0096c5a6;
            *puVar15 = 0;
          }
          if (((uVar2 < uVar3) && (iVar10 != iVar5)) && ((int)uVar12 < iVar5)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                        ,0xfe,
                                        "(!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity)"
                                        ,
                                        "!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity"
                                       );
            if (!bVar8) goto LAB_0096c5a6;
            *puVar15 = 0;
          }
          if ((uVar3 <= uVar2) && (iVar5 <= (int)uVar12)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                        ,0x100,"(isInlineSlot || newCapacity > newInlineCapacity)",
                                        "isInlineSlot || newCapacity > newInlineCapacity");
            if (!bVar8) goto LAB_0096c5a6;
            *puVar15 = 0;
          }
          if (((uVar3 <= uVar2) && (iVar10 != iVar5)) &&
             ((iVar10 - (uint)oldTypeHandler->inlineSlotCapacity != (uint)uVar17 &&
              (((bVar8 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(oldTypeHandler),
                !bVar8 || (uVar4 = oldTypeHandler->inlineSlotCapacity,
                          PVar9 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity(),
                          (uint)uVar4 - (uint)PVar9 != uVar12)) ||
               (PVar9 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity(), uVar17 != PVar9)
               ))))) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                        ,0x10f,
                                        "(isInlineSlot || oldCapacity == newCapacity || slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() || ( oldTypeHandler->IsObjectHeaderInlinedTypeHandler() && newInlineCapacity == oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() && slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() ))"
                                        ,
                                        "isInlineSlot || oldCapacity == newCapacity || slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() || ( oldTypeHandler->IsObjectHeaderInlinedTypeHandler() && newInlineCapacity == oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() && slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() )"
                                       );
            if (!bVar8) goto LAB_0096c5a6;
            *puVar15 = 0;
          }
          pTVar18 = (Type *)(ulong)(iVar5 - uVar12);
          if (iVar5 <= iVar10) {
            pTVar18 = (Type *)0x0;
          }
          if (uVar2 < uVar3) {
            pTVar18 = (Type *)0x0;
          }
          if (0x7fff < (int)pTVar18) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                        ,0x114,
                                        "(requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount))"
                                        ,
                                        "requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount)"
                                       );
            if (!bVar8) {
LAB_0096c5a6:
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            *puVar15 = 0;
          }
        }
        iVar10 = (int)pTVar18;
        local_50 = typeWithoutProperty;
        if (iVar11 == 0) {
          return;
        }
      }
    }
    pDVar16 = VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    Cache<false,false,true>
              (false,pDVar16,isRoot,(object->type).ptr,local_50,propertyId,uVar17,uVar2 < uVar3,
               false,iVar10,info,requestContext);
  }
  return;
}

Assistant:

void CacheOperators::CachePropertyWrite(
        RecyclableObject * object,
        const bool isRoot,
        Type* typeWithoutProperty,
        PropertyId propertyId,
        PropertyValueInfo* info,
        ScriptContext * requestContext)
    {
        Assert(typeWithoutProperty != nullptr);

        if (!CacheOperators::CanCachePropertyWrite(info, object, requestContext))
        {
            return;
        }

        BOOL isSetter = (info->GetFlags() == InlineCacheSetterFlag);

        if (info->GetInstance() != object) // We can't cache if slot owner is not the object
        {
            if (!isSetter)
            {
                AssertMsg(info->IsNoCache() || object->GetPropertyIndex(propertyId) == Constants::NoSlot, "Missed updating PropertyValueInfo?");
                return;
            }
        }

        PropertyIndex propertyIndex = info->GetPropertyIndex();
        if (isSetter)
        {
            if (propertyIndex & 0xf000)
            {
                return;
            }
        }
        else
        {
            if (propertyIndex == Constants::NoSlot)
            {
                return;
            }
        }

        Assert((!isRoot && propertyIndex == object->GetPropertyIndex(propertyId)) || isSetter ||
            (isRoot && propertyIndex == VarTo<RootObjectBase>(object)->GetRootPropertyIndex(propertyId)));
        Assert(DynamicType::Is(object->GetTypeId()));
        AssertMsg((info->GetFlags() & InlineCacheGetterFlag) == 0, "invalid getter for CachePropertyWrite");

        RecyclableObject* instance = info->GetInstance();
        DynamicObject * dynamicInstance = VarTo<DynamicObject>(instance);
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicInstance->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(propertyIndex, &slotIndex, &isInlineSlot);

        if (!isSetter)
        {
            AssertMsg(instance == object, "invalid instance for non setter");
            Assert(DynamicType::Is(typeWithoutProperty));
#if ENABLE_FIXED_FIELDS
            Assert(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || object->CanStorePropertyValueDirectly(propertyId, isRoot));
#endif
            Assert(info->IsWritable());

            DynamicType* newType = (DynamicType*)object->GetType();
            DynamicType* oldType = (DynamicType*)typeWithoutProperty;

            Assert(newType);

            int requiredAuxSlotCapacity;
            // Don't cache property adds for types that aren't (yet) shared.  We must go down the slow path to force type sharing
            // and invalidate any potential fixed fields this type may have.
            // Don't cache property adds to prototypes, so we don't have to check if the object is a prototype on the fast path.
            if (newType != oldType && newType->GetIsShared() && newType->GetTypeHandler()->IsPathTypeHandler() && (!oldType->GetTypeHandler()->GetIsPrototype()))
            {
                DynamicTypeHandler* oldTypeHandler = oldType->GetTypeHandler();
                DynamicTypeHandler* newTypeHandler = newType->GetTypeHandler();

                // This may be the transition from deferred type handler to path type handler. Don't try to cache now.
                if (!oldTypeHandler->IsPathTypeHandler())
                {
                    return;
                }

                int oldCapacity = oldTypeHandler->GetSlotCapacity();
                int newCapacity = newTypeHandler->GetSlotCapacity();
                int newInlineCapacity = newTypeHandler->GetInlineSlotCapacity();

                // We are adding only one property here.  If some other properties were added as a side effect on the slow path
                // we should never cache the type transition, as the other property slots will not be populated by the fast path.
                AssertMsg(((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() + 1 == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount() ||
                          ((PathTypeHandlerBase *)oldTypeHandler)->GetPropertyCount() == ((PathTypeHandlerBase *)newTypeHandler)->GetPropertyCount(),
                    "Don't cache type transitions that add multiple properties.");

                // InlineCache::TrySetProperty assumes the following invariants to decide if and how to adjust auxiliary slot capacity.
                AssertMsg(DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(oldTypeHandler, newTypeHandler),
                    "TypeHandler should be compatible for transition.");

                // If the slot is inlined then we should never need to adjust auxiliary slot capacity.
                Assert(!isInlineSlot || oldCapacity == newCapacity || newCapacity <= newInlineCapacity);
                // If the slot is not inlined then the new type must have some auxiliary slots.
                Assert(isInlineSlot || newCapacity > newInlineCapacity);

                // If the slot is not inlined and the property being added exceeds the old type's slot capacity, then slotIndex corresponds
                // to the number of occupied auxiliary slots (i.e. the old type's auxiliary slot capacity).
                // If the object is optimized for <=2 properties, then slotIndex should be same as the oldCapacity(as there is no inlineSlots in the new typeHandler).
                Assert(
                    isInlineSlot ||
                    oldCapacity == newCapacity ||
                    slotIndex == oldCapacity - oldTypeHandler->GetInlineSlotCapacity() ||
                    (
                        oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
                        newInlineCapacity ==
                            oldTypeHandler->GetInlineSlotCapacity() -
                            DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() &&
                        slotIndex == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
                    ));

                requiredAuxSlotCapacity = (!isInlineSlot && oldCapacity < newCapacity) ? newCapacity - newInlineCapacity : 0;

                // Required auxiliary slot capacity must fit in the available inline cache bits.
                Assert(requiredAuxSlotCapacity < (0x01 << InlineCache::RequiredAuxSlotCapacityBitCount));
            }
            else
            {
                typeWithoutProperty = nullptr;
                requiredAuxSlotCapacity = 0;
            }

            Cache<false, false, true>(
                false,
                VarTo<DynamicObject>(object),
                isRoot,
                object->GetType(),
                typeWithoutProperty,
                propertyId,
                slotIndex,
                isInlineSlot,
                false,
                requiredAuxSlotCapacity,
                info,
                requestContext);
            return;
        }

        const bool isProto = instance != object;
        if(isProto && instance->GetScriptContext() != requestContext)
        {
            // Don't cache if object and prototype are from different context
            return;
        }

        Cache<true, false, false>(
            isProto,
            dynamicInstance,
            false,
            object->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            false,
            0,
            info,
            requestContext);
    }